

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_AB.dlopen.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  code *pcVar5;
  long lVar6;
  code *pcVar7;
  char *error;
  _func_int *call_B;
  _func_int *call_A;
  void *handle_B;
  void *handle_A;
  char **argv_local;
  int argc_local;
  
  lVar2 = dlopen(libB,1);
  pFVar1 = _stderr;
  if (lVar2 == 0) {
    uVar3 = dlerror();
    fprintf(pFVar1,"%s\n",uVar3);
    exit(1);
  }
  lVar4 = dlopen(libA,1);
  pFVar1 = _stderr;
  if (lVar4 == 0) {
    uVar3 = dlerror();
    fprintf(pFVar1,"%s\n",uVar3);
    exit(1);
  }
  pcVar5 = (code *)dlsym(lVar4,"call_A");
  lVar6 = dlerror();
  if (lVar6 != 0) {
    fprintf(_stderr,"%s\n",lVar6);
    exit(1);
  }
  pcVar7 = (code *)dlsym(lVar2,"call_B");
  lVar6 = dlerror();
  if (lVar6 != 0) {
    fprintf(_stderr,"%s\n",lVar6);
    exit(1);
  }
  printf("  main_AB->");
  (*pcVar5)();
  printf("  main_AB->");
  (*pcVar7)();
  dlclose(lVar2);
  dlclose(lVar4);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  (void)argc;
  (void)argv;

  void *handle_A;
  void *handle_B;
  int (*call_A)(void);
  int (*call_B)(void);
  char *error;

  handle_B = dlopen(libB, DLOPEN_FLAGS);
  if(handle_B == NULL) {
    fprintf(stderr, "%s\n", dlerror());
    exit(EXIT_FAILURE);
  }

  handle_A = dlopen(libA, DLOPEN_FLAGS);
  if(handle_A == NULL) {
    fprintf(stderr, "%s\n", dlerror());
    exit(EXIT_FAILURE);
  }


  call_A = dlsym(handle_A, "call_A");
  error = dlerror();
  if(error != NULL) {
    fprintf(stderr, "%s\n", error);
    exit(EXIT_FAILURE);
  }
  call_B = dlsym(handle_B, "call_B");
  error = dlerror();
  if(error != NULL) {
    fprintf(stderr, "%s\n", error);
    exit(EXIT_FAILURE);
  }

  printf("  main_AB->");
  call_A();
  printf("  main_AB->");
  call_B();

  dlclose(handle_B);
  dlclose(handle_A);

  return 0;
}